

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.cpp
# Opt level: O1

void __thiscall
Js::
JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
::Finalize(JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
           *this,bool isShutdown)

{
  uchar *buffer;
  
  buffer = (this->mappedSource).ptr;
  if (buffer != (uchar *)0x0) {
    if (this->mappedAllocLength != 0) {
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,this->mappedAllocLength);
    }
    (this->mappedSource).ptr = (uchar *)0x0;
  }
  this->sourceContext = 0;
  (this->mappedScriptValue).ptr = (void *)0x0;
  this->scriptLoadCallback = (Type)0x0;
  this->scriptUnloadCallback = (Type)0x0;
  return;
}

Assistant:

void JsrtSourceHolder<JsSerializedLoadScriptCallback, JsSerializedScriptUnloadCallback>::Finalize(bool isShutdown)
    {
        if (this->mappedSource != nullptr)
        {
            JsrtSourceHolderPolicy<JsSerializedLoadScriptCallback>::FreeMappedSource(
                this->mappedSource, this->mappedAllocLength);
            this->mappedSource = nullptr;
        }
        this->mappedScriptValue = nullptr;

        // Don't allow load or unload again after told to unload.
        scriptLoadCallback = nullptr;
        scriptUnloadCallback = nullptr;
        sourceContext = NULL;
    }